

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int CVodeGetNumLinIters(void *cvode_mem,long *nliters)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetNumLinIters",&local_10,&local_18);
  if (iVar1 == 0) {
    *nliters = local_18->nli;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumLinIters(void* cvode_mem, long int* nliters)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }
  *nliters = cvls_mem->nli;
  return (CVLS_SUCCESS);
}